

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_add(Curl_hash *h,void *key,size_t key_len,void *p)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  Curl_hash_element *ne;
  int local_4c;
  int i;
  Curl_llist *l;
  Curl_llist_element *le;
  Curl_hash_element *he;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table == (Curl_llist *)0x0) {
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)((long)h->slots << 5);
    h->table = pCVar1;
    if (h->table == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    for (local_4c = 0; local_4c < h->slots; local_4c = local_4c + 1) {
      Curl_llist_init(h->table + local_4c,hash_element_dtor);
    }
  }
  pCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  pCVar1 = pCVar1 + sVar2;
  l = (Curl_llist *)pCVar1->head;
  do {
    if (l == (Curl_llist *)0x0) {
LAB_00a2be4e:
      ne = mk_hash_element(key,key_len,p);
      if (ne == (Curl_hash_element *)0x0) {
        h_local = (Curl_hash *)0x0;
      }
      else {
        Curl_llist_insert_next(pCVar1,pCVar1->tail,ne,&ne->list);
        h->size = h->size + 1;
        h_local = (Curl_hash *)p;
      }
      return h_local;
    }
    sVar2 = (*h->comp_func)(&l->head[1].next,(size_t)l->head[1].prev,key,key_len);
    if (sVar2 != 0) {
      Curl_llist_remove(pCVar1,(Curl_llist_element *)l,h);
      h->size = h->size - 1;
      goto LAB_00a2be4e;
    }
    l = (Curl_llist *)l->dtor;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct Curl_hash *h, void *key, size_t key_len, void *p)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  if(!h->table) {
    int i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct Curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    Curl_llist_insert_next(l, l->tail, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}